

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::DenseVector::~DenseVector(DenseVector *this)

{
  ~DenseVector(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DenseVector::~DenseVector() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.DenseVector)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}